

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

int __thiscall ncnn::Layer::forward(Layer *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  Mat *pMVar2;
  long in_RCX;
  Mat *in_RDX;
  __fn *in_RSI;
  long *in_RDI;
  void *in_R8;
  bool bVar3;
  Mat local_f8;
  long local_b0;
  Mat *local_a8;
  int local_8c;
  int local_88;
  undefined4 local_84;
  Mat *local_80;
  Mat *local_78;
  Mat *local_68;
  Mat *local_58;
  int local_40;
  undefined4 local_3c;
  Mat *local_38;
  int local_30;
  undefined4 local_2c;
  Mat *local_28;
  void *local_20;
  Mat *local_8;
  
  if ((*(byte *)((long)in_RDI + 9) & 1) == 0) {
    local_8c = -1;
  }
  else {
    local_b0 = in_RCX;
    local_a8 = in_RDX;
    Mat::clone(&local_f8,in_RSI,*(void **)(in_RCX + 8),(int)in_RCX,in_R8);
    pMVar2 = local_a8;
    local_78 = local_a8;
    local_80 = &local_f8;
    if (local_a8 != local_80) {
      if (local_f8.refcount != (int *)0x0) {
        local_84 = 1;
        LOCK();
        local_88 = *local_f8.refcount;
        *local_f8.refcount = *local_f8.refcount + 1;
        UNLOCK();
      }
      local_28 = local_a8;
      if (local_a8->refcount != (int *)0x0) {
        piVar1 = local_a8->refcount;
        local_2c = 0xffffffff;
        LOCK();
        local_30 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_30 == 1) {
          if (local_a8->allocator == (Allocator *)0x0) {
            local_20 = local_a8->data;
            if (local_20 != (void *)0x0) {
              free(local_20);
            }
          }
          else {
            (**(code **)(*(long *)local_a8->allocator + 0x18))(local_a8->allocator,local_a8->data);
          }
        }
      }
      pMVar2->data = (void *)0x0;
      pMVar2->elemsize = 0;
      pMVar2->elempack = 0;
      pMVar2->dims = 0;
      pMVar2->w = 0;
      pMVar2->h = 0;
      pMVar2->d = 0;
      pMVar2->c = 0;
      pMVar2->cstep = 0;
      pMVar2->refcount = (int *)0x0;
      pMVar2->data = local_80->data;
      pMVar2->refcount = local_80->refcount;
      pMVar2->elemsize = local_80->elemsize;
      pMVar2->elempack = local_80->elempack;
      pMVar2->allocator = local_80->allocator;
      pMVar2->dims = local_80->dims;
      pMVar2->w = local_80->w;
      pMVar2->h = local_80->h;
      pMVar2->d = local_80->d;
      pMVar2->c = local_80->c;
      pMVar2->cstep = local_80->cstep;
    }
    local_68 = &local_f8;
    local_38 = local_68;
    if (local_f8.refcount != (int *)0x0) {
      local_3c = 0xffffffff;
      LOCK();
      local_40 = *local_f8.refcount;
      *local_f8.refcount = *local_f8.refcount + -1;
      UNLOCK();
      if (local_40 == 1) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_f8.allocator + 0x18))(local_f8.allocator,local_f8.data);
        }
      }
    }
    local_f8.data = (void *)0x0;
    local_f8.elemsize = 0;
    local_f8.elempack = 0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    local_f8.cstep = 0;
    local_f8.refcount = (int *)0x0;
    local_58 = local_a8;
    bVar3 = true;
    if (local_a8->data != (void *)0x0) {
      local_8 = local_a8;
      bVar3 = local_a8->cstep * (long)local_a8->c == 0;
    }
    if (bVar3) {
      local_8c = -100;
    }
    else {
      local_8c = (**(code **)(*in_RDI + 0x48))(in_RDI,local_a8,local_b0);
    }
  }
  return local_8c;
}

Assistant:

int Layer::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blob = bottom_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    return forward_inplace(top_blob, opt);
}